

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O0

void __thiscall lsim::gui::CircuitEditor::ui_fix_wire(CircuitEditor *this,ModelWire *wire)

{
  ModelCircuit *this_00;
  size_t this_01;
  bool bVar1;
  uint32_t id;
  size_t sVar2;
  ModelWireSegment *pMVar3;
  ModelWire *this_02;
  reference ppMVar4;
  ModelWireJunction *pMVar5;
  Point *p0;
  Point *p1;
  ModelWireSegment *segment;
  iterator __end4;
  iterator __begin4;
  segment_set_t *__range4;
  ModelWire *new_wire;
  segment_set_t reachable_segments;
  ModelWire *wire_local;
  CircuitEditor *this_local;
  
  reachable_segments._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)wire;
  ModelWire::clear_pins(wire);
  bVar1 = ModelWire::in_one_piece
                    ((ModelWire *)
                     reachable_segments._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    ModelWire::simplify((ModelWire *)
                        reachable_segments._M_t._M_impl.super__Rb_tree_header._M_node_count);
    wire_make_connections
              (this,(ModelWire *)reachable_segments._M_t._M_impl.super__Rb_tree_header._M_node_count
              );
  }
  else {
    while (sVar2 = ModelWire::num_segments
                             ((ModelWire *)
                              reachable_segments._M_t._M_impl.super__Rb_tree_header._M_node_count),
          this_01 = reachable_segments._M_t._M_impl.super__Rb_tree_header._M_node_count, sVar2 != 0)
    {
      pMVar3 = ModelWire::segment_by_index
                         ((ModelWire *)
                          reachable_segments._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
      ModelWire::reachable_segments((segment_set_t *)&new_wire,(ModelWire *)this_01,pMVar3);
      this_02 = ModelCircuit::create_wire(this->m_model_circuit);
      __end4 = std::
               set<lsim::ModelWireSegment_*,_std::less<lsim::ModelWireSegment_*>,_std::allocator<lsim::ModelWireSegment_*>_>
               ::begin((set<lsim::ModelWireSegment_*,_std::less<lsim::ModelWireSegment_*>,_std::allocator<lsim::ModelWireSegment_*>_>
                        *)&new_wire);
      segment = (ModelWireSegment *)
                std::
                set<lsim::ModelWireSegment_*,_std::less<lsim::ModelWireSegment_*>,_std::allocator<lsim::ModelWireSegment_*>_>
                ::end((set<lsim::ModelWireSegment_*,_std::less<lsim::ModelWireSegment_*>,_std::allocator<lsim::ModelWireSegment_*>_>
                       *)&new_wire);
      while (bVar1 = std::operator!=(&__end4,(_Self *)&segment), bVar1) {
        ppMVar4 = std::_Rb_tree_const_iterator<lsim::ModelWireSegment_*>::operator*(&__end4);
        pMVar3 = *ppMVar4;
        pMVar5 = ModelWireSegment::junction(pMVar3,0);
        p0 = ModelWireJunction::position(pMVar5);
        pMVar5 = ModelWireSegment::junction(pMVar3,1);
        p1 = ModelWireJunction::position(pMVar5);
        ModelWire::add_segment(this_02,p0,p1);
        ModelWire::remove_segment
                  ((ModelWire *)reachable_segments._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   pMVar3);
        std::_Rb_tree_const_iterator<lsim::ModelWireSegment_*>::operator++(&__end4);
      }
      ModelWire::simplify(this_02);
      wire_make_connections(this,this_02);
      std::
      set<lsim::ModelWireSegment_*,_std::less<lsim::ModelWireSegment_*>,_std::allocator<lsim::ModelWireSegment_*>_>
      ::~set((set<lsim::ModelWireSegment_*,_std::less<lsim::ModelWireSegment_*>,_std::allocator<lsim::ModelWireSegment_*>_>
              *)&new_wire);
    }
    this_00 = this->m_model_circuit;
    id = ModelWire::id((ModelWire *)
                       reachable_segments._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ModelCircuit::remove_wire(this_00,id);
  }
  return;
}

Assistant:

void CircuitEditor::ui_fix_wire(ModelWire* wire) {
	wire->clear_pins();

	if (!wire->in_one_piece()) {
		while (wire->num_segments() > 0) {
			auto reachable_segments = wire->reachable_segments(wire->segment_by_index(0));
			ModelWire* new_wire = m_model_circuit->create_wire();

			for (auto segment : reachable_segments) {
				new_wire->add_segment(segment->junction(0)->position(), segment->junction(1)->position());
				wire->remove_segment(segment);
			}

			new_wire->simplify();
			wire_make_connections(new_wire);
		}

		m_model_circuit->remove_wire(wire->id());
	} else {
		wire->simplify();
		wire_make_connections(wire);
	}
}